

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# methods.hpp
# Opt level: O1

string * ANSsint<320u>::name_abi_cxx11_(void)

{
  size_type *psVar1;
  ulong uVar2;
  undefined8 uVar3;
  undefined8 *puVar4;
  ulong uVar5;
  string *in_RDI;
  string __str;
  ulong *local_58;
  uint local_50;
  undefined4 uStack_4c;
  ulong local_48 [2];
  ulong *local_38;
  long local_30;
  ulong local_28 [2];
  
  local_38 = local_28;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_38,"ANSsint-","");
  local_58 = local_48;
  std::__cxx11::string::_M_construct((ulong)&local_58,'\x03');
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_58,local_50,0x140);
  uVar2 = CONCAT44(uStack_4c,local_50) + local_30;
  uVar5 = 0xf;
  if (local_38 != local_28) {
    uVar5 = local_28[0];
  }
  if (uVar5 < uVar2) {
    uVar5 = 0xf;
    if (local_58 != local_48) {
      uVar5 = local_48[0];
    }
    if (uVar2 <= uVar5) {
      puVar4 = (undefined8 *)
               std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,(ulong)local_38);
      goto LAB_0015af01;
    }
  }
  puVar4 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_38,(ulong)local_58);
LAB_0015af01:
  (in_RDI->_M_dataplus)._M_p = (pointer)&in_RDI->field_2;
  psVar1 = puVar4 + 2;
  if ((size_type *)*puVar4 == psVar1) {
    uVar3 = puVar4[3];
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
    *(undefined8 *)((long)&in_RDI->field_2 + 8) = uVar3;
  }
  else {
    (in_RDI->_M_dataplus)._M_p = (pointer)*puVar4;
    (in_RDI->field_2)._M_allocated_capacity = *psVar1;
  }
  in_RDI->_M_string_length = puVar4[1];
  *puVar4 = psVar1;
  puVar4[1] = 0;
  *(undefined1 *)psVar1 = 0;
  if (local_58 != local_48) {
    operator_delete(local_58,local_48[0] + 1);
  }
  if (local_38 != local_28) {
    operator_delete(local_38,local_28[0] + 1);
  }
  return in_RDI;
}

Assistant:

static std::string name()
    {
        return std::string("ANSsint-") + std::to_string(H_approx);
    }